

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O2

vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> * __thiscall
dg::vr::VRLocation::getSuccLocations
          (vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,VRLocation *this)

{
  pointer puVar1;
  unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *edge;
  pointer puVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->successors).
           super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->successors).
                super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>::push_back
              (__return_storage_ptr__,
               &((puVar2->_M_t).
                 super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t.
                 super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
                 super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl)->target);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VRLocation *> VRLocation::getSuccLocations() {
    std::vector<VRLocation *> result;
    for (auto &edge : successors) {
        result.push_back(edge->target);
    }
    return result;
}